

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O3

void locatePath(char **path,uint *pathLength,char *relPath,uint relPathLength,char *systemDir,
               uint systemDirLength,void *symbol)

{
  int iVar1;
  int iVar2;
  uchar uVar3;
  char *path_00;
  uint uVar4;
  size_t __n;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong __n_00;
  ulong uVar8;
  uint systemBasePathLength;
  uint bundlePathLength;
  char *bundlePath;
  char *executablePath;
  uint lengths [3];
  char *dir;
  char *libraryPath;
  uint libraryPathDirectoryLength;
  uint libraryPathLength;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *dirs [3];
  uint local_c0;
  uint local_bc;
  ulong local_b8;
  char *local_b0;
  char *local_a8;
  uint local_9c [3];
  char *local_90;
  ulong local_88;
  ulong local_80;
  char *local_78;
  char *local_70;
  long local_68;
  char *local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  char *local_48 [3];
  
  uVar3 = checkStringOutParameter(path,pathLength);
  if (uVar3 != '\0') {
    local_a8 = (char *)0x0;
    local_4c = 0;
    local_b8 = (ulong)relPathLength;
    local_78 = systemDir;
    getExecutablePath(&local_a8,&local_4c);
    local_50 = 0;
    local_b0 = (char *)0x0;
    local_bc = 0;
    getBundlePath(&local_b0,&local_bc);
    local_60 = (char *)0x0;
    local_54 = 0;
    getLibraryPath(symbol,&local_60,&local_54);
    local_58 = 0;
    getDirectoryPart(local_60,local_54,&local_58);
    getDirectoryPart(local_a8,local_4c,&local_50);
    uVar8 = local_b8;
    uVar4 = local_58;
    if (local_58 < local_50) {
      uVar4 = local_50;
    }
    local_9c[0] = local_58;
    local_88 = (ulong)local_bc;
    if (uVar4 <= local_bc + 0x13) {
      uVar4 = local_bc + 0x13;
    }
    iVar1 = (int)local_b8;
    local_48[0] = local_60;
    local_48[1] = local_a8;
    local_90 = local_b0;
    local_48[2] = local_b0;
    local_9c[1] = local_50;
    local_9c[2] = local_bc;
    path_00 = (char *)malloc((ulong)(iVar1 + 9 + uVar4));
    __n_00 = uVar8 & 0xffffffff;
    local_80 = (ulong)systemDirLength;
    lVar6 = 0;
    do {
      uVar4 = local_9c[lVar6];
      uVar7 = (ulong)uVar4;
      if (uVar7 != 0) {
        local_68 = lVar6;
        local_70 = local_48[lVar6];
        memcpy(path_00,local_70,uVar7);
        __n = 1;
        do {
          memcpy(path_00 + uVar7,"/../../",__n);
          iVar2 = (int)__n;
          memcpy(path_00 + (iVar2 + uVar4),relPath,__n_00);
          uVar5 = iVar1 + uVar4 + iVar2;
          path_00[uVar5] = '\0';
          uVar3 = fileExists(path_00,uVar5);
          lVar6 = local_68;
          uVar8 = local_b8;
          if (uVar3 != '\0') {
            uVar4 = uVar4 + iVar2;
            goto LAB_001017b4;
          }
          __n = __n + 3;
        } while (__n != 10);
        if (systemDirLength != 0) {
          getSystemBasePath(local_70,uVar4 + 1,&local_c0);
          uVar4 = local_c0;
          if ((ulong)local_c0 != 0) {
            path_00[local_c0] = '/';
            memcpy(path_00 + (local_c0 + 1),local_78,local_80);
            uVar5 = uVar4 + systemDirLength + 1;
            path_00[uVar5] = '/';
            uVar4 = uVar4 + 2 + systemDirLength;
            memcpy(path_00 + uVar4,relPath,__n_00);
            uVar5 = uVar5 + (int)uVar8 + 1;
            path_00[uVar5] = '\0';
            uVar3 = fileExists(path_00,uVar5);
            if (uVar3 != '\0') goto LAB_001017b4;
          }
        }
      }
      uVar7 = local_88;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    memcpy(path_00,local_90,local_88);
    builtin_strncpy(path_00 + uVar7,"/Contents/Resources/",0x14);
    iVar1 = (int)uVar7;
    uVar4 = iVar1 + 0x14;
    memcpy(path_00 + uVar4,relPath,__n_00);
    uVar5 = iVar1 + (int)uVar8 + 0x14;
    path_00[uVar5] = '\0';
    uVar3 = fileExists(path_00,uVar5);
    if (uVar3 == '\0') {
      invalidateStringOutParameter(path,pathLength);
    }
    else {
LAB_001017b4:
      copyToStringOutParameter(path_00,uVar4,path,pathLength);
    }
    free(local_60);
    free(local_a8);
    free(local_b0);
    free(path_00);
  }
  return;
}

Assistant:

void locatePath(char ** path, unsigned int * pathLength, const char * relPath, unsigned int relPathLength,
    const char * systemDir, unsigned int systemDirLength, void * symbol)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Obtain executable path
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    // Obtain bundle path (in case of macOS)
    char * bundlePath = 0x0;
    unsigned int bundlePathLength = 0;
    getBundlePath(&bundlePath, &bundlePathLength);

    // Obtain library path
    char * libraryPath = 0x0;
    unsigned int libraryPathLength = 0;
    getLibraryPath(symbol, &libraryPath, &libraryPathLength);
    unsigned int libraryPathDirectoryLength = 0;

    // Extract directory parts of executable and library paths
    getDirectoryPart(libraryPath, libraryPathLength, &libraryPathDirectoryLength);
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Compute the size of the maximal possible path to circumvent reallocation of output
    unsigned int maxLength = executablePathDirectoryLength;
    maxLength = maxLength > libraryPathDirectoryLength ? maxLength : libraryPathDirectoryLength;
    maxLength = maxLength > bundlePathLength + 19 ? maxLength : bundlePathLength + 19; // for "/Contents/Resources"
    maxLength += relPathLength + 7 + 2; // for the extra upward path checks, the extra path delimiter and null byte suffix

    const char * dirs[] = { libraryPath, executablePath, bundlePath };
    const unsigned int lengths[] = { libraryPathDirectoryLength, executablePathDirectoryLength, bundlePathLength };

    char * subdir = (char *)malloc(sizeof(char) * maxLength);
    unsigned int subdirLength = 0;
    unsigned int resultdirLength = 0;

    // Check libraryPath, executablePath, and bundlePath as base directories
    for (unsigned char i = 0; i < 3; ++i)
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[i];
        const unsigned int length = lengths[i];

        // Early out for missing base directory
        if (length <= 0)
        {
            continue;
        }

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        // Check <basedir>/<relpath>, <basedir>/../<relpath>, and <basedir>/../../<relpath>
        for (unsigned char j = 0; j < 3; ++j)
        {
            unsigned char relDirLength = j * 3 + 1;

            subdirLength = length;
            // Copy either '/', '/../', or '/../../', depending on current iteration
            memcpy(subdir+subdirLength, "/../../", relDirLength);
            subdirLength += relDirLength;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }

        if (systemDirLength <= 0)
            continue;

        // Check if it is a system path
        // length + 1 points to the '/' of the directory part of the path

        unsigned int systemBasePathLength;
        getSystemBasePath(dir, length + 1, &systemBasePathLength);

        if (systemBasePathLength > 0)
        {
            subdirLength = systemBasePathLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, systemDir, systemDirLength);
            subdirLength += systemDirLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }
    }

    // Check app bundle resources
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[2];
        const unsigned int length = lengths[2];

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        subdirLength = length;
        memcpy(subdir+subdirLength, "/Contents/Resources/", 20);
        subdirLength += 20;
        memcpy(subdir+subdirLength, relPath, relPathLength);
        resultdirLength = subdirLength;
        subdirLength += relPathLength;

        // End subdirectory with null byte for system functions
        subdir[subdirLength] = 0;

        if (fileExists(subdir, subdirLength)) // successfully found directory
        {
            copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

            goto out;
        }
    }

    // Could not find path
    invalidateStringOutParameter(path, pathLength);

out:
    // Free temporary memory
    free(libraryPath);
    free(executablePath);
    free(bundlePath);
    free(subdir);
}